

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O0

uint __thiscall ON_SubDEdge::MarkedVertexCount(ON_SubDEdge *this)

{
  bool bVar1;
  ON_SubDVertex *v;
  uint evi;
  uint mark_count;
  ON_SubDEdge *this_local;
  
  v._4_4_ = 0;
  for (v._0_4_ = 0; (uint)v < 2; v._0_4_ = (uint)v + 1) {
    if ((this->m_vertex[(uint)v] != (ON_SubDVertex *)0x0) &&
       (bVar1 = ON_ComponentStatus::RuntimeMark
                          (&(this->m_vertex[(uint)v]->super_ON_SubDComponentBase).m_status), bVar1))
    {
      v._4_4_ = v._4_4_ + 1;
    }
  }
  return v._4_4_;
}

Assistant:

unsigned int ON_SubDEdge::MarkedVertexCount() const
{
  unsigned int mark_count = 0;
  for (unsigned evi = 0; evi < 2; ++evi)
  {
    const ON_SubDVertex* v = m_vertex[evi];
    if (nullptr != v && v->m_status.RuntimeMark())
      ++mark_count;
  }
  return mark_count;
}